

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_encoding(tcv_t *tcv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -4;
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if (iVar2 == 0) {
      if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
        cVar1 = '\0';
      }
      else {
        cVar1 = tcv->initialized;
      }
      if (cVar1 == '\0') {
        iVar3 = 0;
      }
      else {
        iVar3 = (*tcv->fun->get_encoding)(tcv);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
    }
  }
  return iVar3;
}

Assistant:

int tcv_get_encoding(tcv_t *tcv)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	ret = tcv_is_initialized(tcv);
	if (ret) {
		ret = tcv->fun->get_encoding(tcv);
	}

	tcv_unlock(tcv);
	return ret;
}